

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

int gauden_scale_densities_bwd
              (float64 ***den,uint32 ***den_idx,float64 **scale,uint32 *cb,uint32 n_cb,gauden_t *g)

{
  uint uVar1;
  float64 *pfVar2;
  double dVar3;
  float64 *scl;
  uint32 k;
  uint32 j;
  uint32 c;
  uint32 i;
  gauden_t *g_local;
  uint32 n_cb_local;
  uint32 *cb_local;
  float64 **scale_local;
  uint32 ***den_idx_local;
  float64 ***den_local;
  
  if (g->n_density < g->n_top) {
    __assert_fail("g->n_top <= g->n_density",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,0x53e,
                  "int gauden_scale_densities_bwd(float64 ***, uint32 ***, float64 **, uint32 *, uint32, gauden_t *)"
                 );
  }
  pfVar2 = *scale;
  j = 0;
  do {
    if (n_cb <= j) {
      return 0;
    }
    uVar1 = cb[j];
    for (scl._4_4_ = 0; scl._4_4_ < g->n_feat; scl._4_4_ = scl._4_4_ + 1) {
      if ((double)pfVar2[scl._4_4_] <= -708.407751281802) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                ,0x547,"Scaling factor too small: %f\n",pfVar2[scl._4_4_]);
        pfVar2[scl._4_4_] = -698.407751281802;
      }
      for (scl._0_4_ = 0; (uint)scl < g->n_top; scl._0_4_ = (uint)scl + 1) {
        dVar3 = exp((double)den[uVar1][scl._4_4_][(uint)scl] - (double)pfVar2[scl._4_4_]);
        den[uVar1][scl._4_4_][(uint)scl] = (float64)dVar3;
        if (0x7fefffffffffffff < (ulong)ABS((double)den[uVar1][scl._4_4_][(uint)scl])) {
          __assert_fail("finite(den[c][j][k])",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                        ,0x54c,
                        "int gauden_scale_densities_bwd(float64 ***, uint32 ***, float64 **, uint32 *, uint32, gauden_t *)"
                       );
        }
      }
    }
    j = j + 1;
  } while( true );
}

Assistant:

int
gauden_scale_densities_bwd(float64 ***den,		/* density array for a mixture Gaussian */
			   uint32 ***den_idx,
			   float64 **scale,
			   uint32 *cb,		/* Codebook indices */
			   uint32 n_cb,		/* total # of codebooks to scale */
			   gauden_t *g)		/* Gaussian density structure */
{
    uint32 i, c, j, k;
    float64 *scl;

    /* make sure this is true at initialization time */
    assert(g->n_top <= g->n_density);

    scl = *scale;

    /* Subtract/Divide max density from others */
    for (i = 0; i < n_cb; i++) {
	c = cb[i];
	for (j = 0; j < g->n_feat; j++) {
	    if (scl[j] <= MINUS_LOG_INFINITY) {
		E_WARN("Scaling factor too small: %f\n", scl[j]);
		scl[j] = MINUS_LOG_INFINITY + MAX_LOG_DEN;
	    }
	    for (k = 0; k < g->n_top; k++) {
		den[c][j][k] = exp(den[c][j][k] - scl[j]);
		assert(finite(den[c][j][k]));
	    }
	}
    }
		
    return S3_SUCCESS;
}